

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::minUInt(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  uint uVar1;
  uint uVar2;
  Literal *local_48;
  Literal *other_local;
  Literal *this_local;
  
  uVar1 = geti32(this);
  uVar2 = geti32(other);
  local_48 = other;
  if (uVar1 < uVar2) {
    local_48 = this;
  }
  Literal(__return_storage_ptr__,local_48);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::minUInt(const Literal& other) const {
  return uint32_t(geti32()) < uint32_t(other.geti32()) ? *this : other;
}